

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  ImGuiStorage *this_00;
  ImGuiStoragePair *pIVar1;
  ImGuiTabBar *this_01;
  int n;
  int i;
  
  this_00 = &this->Map;
  for (i = 0; i < (this_00->Data).Size; i = i + 1) {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&this_00->Data,i);
    if ((pIVar1->field_1).val_i != -1) {
      this_01 = ImVector<ImGuiTabBar>::operator[](&this->Buf,(pIVar1->field_1).val_i);
      ImGuiTabBar::~ImGuiTabBar(this_01);
    }
  }
  ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&this_00->Data);
  ImVector<ImGuiTabBar>::clear(&this->Buf);
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }